

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void Qiniu_Buffer_appendEncodedString(Qiniu_Buffer *self,Qiniu_Valist *ap)

{
  uint uVar1;
  char *__s;
  size_t cb;
  undefined8 *local_40;
  size_t n;
  char *v;
  Qiniu_Valist *ap_local;
  Qiniu_Buffer *self_local;
  
  uVar1 = ap->items[0].gp_offset;
  if (uVar1 < 0x29) {
    local_40 = (undefined8 *)((long)(int)uVar1 + (long)ap->items[0].reg_save_area);
    ap->items[0].gp_offset = uVar1 + 8;
  }
  else {
    local_40 = (undefined8 *)ap->items[0].overflow_arg_area;
    ap->items[0].overflow_arg_area = local_40 + 1;
  }
  __s = (char *)*local_40;
  cb = strlen(__s);
  Qiniu_Buffer_AppendEncodedBinary(self,__s,cb);
  return;
}

Assistant:

void Qiniu_Buffer_appendEncodedString(Qiniu_Buffer *self, Qiniu_Valist *ap)
{
	const char *v = va_arg(ap->items, const char *);
	size_t n = strlen(v);
	Qiniu_Buffer_AppendEncodedBinary(self, v, n);
}